

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O0

void Fossilize::filter_active_extensions
               (VkPhysicalDeviceFeatures2 *pdf,char **active_extensions,size_t *out_extension_count)

{
  int iVar1;
  void **ppvVar2;
  VkPhysicalDeviceImage2DViewOf3DFeaturesEXT *feature_9;
  VkPhysicalDevicePrimitivesGeneratedQueryFeaturesEXT *feature_8;
  VkPhysicalDeviceShaderObjectFeaturesEXT *feature_7;
  VkPhysicalDeviceDescriptorBufferFeaturesEXT *feature_6;
  VkPhysicalDeviceMeshShaderFeaturesNV *feature_5;
  VkPhysicalDeviceMeshShaderFeaturesEXT *feature_4;
  VkPhysicalDeviceImageRobustnessFeaturesEXT *feature_3;
  VkPhysicalDeviceRobustness2FeaturesEXT *feature_2;
  VkPhysicalDeviceFragmentShadingRateFeaturesKHR *feature_1;
  VkPhysicalDeviceFragmentShadingRateEnumsFeaturesNV *feature;
  VkBaseOutStructure *s;
  void **ppvStack_30;
  bool accept;
  void **ppNext;
  VkBaseOutStructure *pNext;
  size_t *out_extension_count_local;
  char **active_extensions_local;
  VkPhysicalDeviceFeatures2 *pdf_local;
  
  ppvVar2 = (void **)pdf->pNext;
  pdf->pNext = (void *)0x0;
  ppvStack_30 = &pdf->pNext;
  while (ppNext = ppvVar2, ppNext != (void **)0x0) {
    s._7_1_ = true;
    ppvVar2 = (void **)ppNext[1];
    iVar1 = *(int *)ppNext;
    if (iVar1 == 0x3b9ddf10) {
      if ((*(int *)((long)ppNext + 0x14) == 0) && (*(int *)(ppNext + 2) == 0)) {
        remove_extension(active_extensions,out_extension_count,"VK_NV_mesh_shader");
        s._7_1_ = false;
      }
    }
    else if (iVar1 == 0x3b9e3cd3) {
      if (((*(int *)(ppNext + 3) == 0) && (*(int *)(ppNext + 2) == 0)) &&
         (*(int *)((long)ppNext + 0x14) == 0)) {
        remove_extension(active_extensions,out_extension_count,"VK_KHR_fragment_shading_rate");
        s._7_1_ = false;
      }
    }
    else if (iVar1 == 0x3b9f2730) {
      if (((*(int *)(ppNext + 3) == 0) && (*(int *)(ppNext + 2) == 0)) &&
         (*(int *)((long)ppNext + 0x14) == 0)) {
        remove_extension(active_extensions,out_extension_count,"VK_EXT_robustness2");
        s._7_1_ = false;
      }
    }
    else if (iVar1 == 0x3b9f9c62) {
      if (((*(int *)(ppNext + 2) == 0) && (*(int *)((long)ppNext + 0x14) == 0)) &&
         ((*(int *)(ppNext + 3) == 0 && (*(int *)((long)ppNext + 0x1c) == 0)))) {
        remove_extension(active_extensions,out_extension_count,"VK_EXT_descriptor_buffer");
        s._7_1_ = false;
      }
    }
    else if (iVar1 == 0x3b9fc371) {
      if (((*(int *)(ppNext + 2) == 0) && (*(int *)(ppNext + 3) == 0)) &&
         (*(int *)((long)ppNext + 0x14) == 0)) {
        remove_extension(active_extensions,out_extension_count,"VK_NV_fragment_shading_rate_enums");
        s._7_1_ = false;
      }
    }
    else if (iVar1 == 0x3b9fcb40) {
      if (((*(int *)((long)ppNext + 0x14) == 0) && (*(int *)(ppNext + 2) == 0)) &&
         ((*(int *)(ppNext + 3) == 0 &&
          ((*(int *)((long)ppNext + 0x1c) == 0 && (*(int *)(ppNext + 4) == 0)))))) {
        remove_extension(active_extensions,out_extension_count,"VK_EXT_mesh_shader");
        s._7_1_ = false;
      }
    }
    else if (iVar1 == 0x3b9fe698) {
      iVar1 = *(int *)(ppNext + 2);
      if (iVar1 == 0) {
        remove_extension(active_extensions,out_extension_count,"VK_EXT_image_robustness");
      }
      s._7_1_ = iVar1 != 0;
    }
    else if (iVar1 == 0x3ba09e30) {
      if (((*(int *)(ppNext + 2) == 0) && (*(int *)(ppNext + 3) == 0)) &&
         (*(int *)((long)ppNext + 0x14) == 0)) {
        remove_extension(active_extensions,out_extension_count,"VK_EXT_primitives_generated_query");
        s._7_1_ = false;
      }
    }
    else if (iVar1 == 0x3ba0c928) {
      if ((*(int *)(ppNext + 2) == 0) && (*(int *)((long)ppNext + 0x14) == 0)) {
        remove_extension(active_extensions,out_extension_count,"VK_EXT_image_2d_view_of_3d");
        s._7_1_ = false;
      }
    }
    else if (iVar1 == 0x3ba224d0) {
      iVar1 = *(int *)(ppNext + 2);
      if (iVar1 == 0) {
        remove_extension(active_extensions,out_extension_count,"VK_EXT_shader_object");
      }
      s._7_1_ = iVar1 != 0;
    }
    if (s._7_1_) {
      *ppvStack_30 = ppNext;
      ppvStack_30 = ppNext + 1;
      *ppvStack_30 = (void *)0x0;
    }
  }
  return;
}

Assistant:

static void filter_active_extensions(VkPhysicalDeviceFeatures2 &pdf,
                                     const char **active_extensions, size_t *out_extension_count)
{
	// If we end up disabling features deliberately, we should remove the extension enablement as well,
	// and remove the feature pNext.
	// Some implementations will end up changing their PSO keys even though no features are actually enabled.
	auto *pNext = static_cast<VkBaseOutStructure *>(pdf.pNext);

	pdf.pNext = nullptr;
	void **ppNext = &pdf.pNext;

	while (pNext)
	{
		bool accept = true;
		auto *s = pNext;
		pNext = s->pNext;

		switch (s->sType)
		{
		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_ENUMS_FEATURES_NV:
		{
			auto *feature = reinterpret_cast<VkPhysicalDeviceFragmentShadingRateEnumsFeaturesNV *>(s);
			if (feature->fragmentShadingRateEnums == VK_FALSE &&
			    feature->noInvocationFragmentShadingRates == VK_FALSE &&
			    feature->supersampleFragmentShadingRates == VK_FALSE)
			{
				remove_extension(active_extensions, out_extension_count,
				                 VK_NV_FRAGMENT_SHADING_RATE_ENUMS_EXTENSION_NAME);
				accept = false;
			}
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR:
		{
			auto *feature = reinterpret_cast<VkPhysicalDeviceFragmentShadingRateFeaturesKHR *>(s);
			if (feature->attachmentFragmentShadingRate == VK_FALSE &&
			    feature->pipelineFragmentShadingRate == VK_FALSE &&
			    feature->primitiveFragmentShadingRate == VK_FALSE)
			{
				remove_extension(active_extensions, out_extension_count, VK_KHR_FRAGMENT_SHADING_RATE_EXTENSION_NAME);
				accept = false;
			}
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ROBUSTNESS_2_FEATURES_EXT:
		{
			auto *feature = reinterpret_cast<VkPhysicalDeviceRobustness2FeaturesEXT *>(s);
			if (feature->nullDescriptor == VK_FALSE &&
			    feature->robustBufferAccess2 == VK_FALSE &&
			    feature->robustImageAccess2 == VK_FALSE)
			{
				remove_extension(active_extensions, out_extension_count, VK_EXT_ROBUSTNESS_2_EXTENSION_NAME);
				accept = false;
			}
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_ROBUSTNESS_FEATURES_EXT:
		{
			auto *feature = reinterpret_cast<VkPhysicalDeviceImageRobustnessFeaturesEXT *>(s);
			if (feature->robustImageAccess == VK_FALSE)
			{
				remove_extension(active_extensions, out_extension_count, VK_EXT_IMAGE_ROBUSTNESS_EXTENSION_NAME);
				accept = false;
			}
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_FEATURES_EXT:
		{
			auto *feature = reinterpret_cast<VkPhysicalDeviceMeshShaderFeaturesEXT *>(s);
			if (feature->meshShader == VK_FALSE &&
			    feature->taskShader == VK_FALSE &&
			    feature->multiviewMeshShader == VK_FALSE &&
			    feature->primitiveFragmentShadingRateMeshShader == VK_FALSE &&
			    feature->meshShaderQueries == VK_FALSE)
			{
				remove_extension(active_extensions, out_extension_count, VK_EXT_MESH_SHADER_EXTENSION_NAME);
				accept = false;
			}
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_FEATURES_NV:
		{
			auto *feature = reinterpret_cast<VkPhysicalDeviceMeshShaderFeaturesNV *>(s);
			if (feature->meshShader == VK_FALSE &&
			    feature->taskShader == VK_FALSE)
			{
				remove_extension(active_extensions, out_extension_count, VK_NV_MESH_SHADER_EXTENSION_NAME);
				accept = false;
			}
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_BUFFER_FEATURES_EXT:
		{
			auto *feature = reinterpret_cast<VkPhysicalDeviceDescriptorBufferFeaturesEXT *>(s);
			if (feature->descriptorBuffer == VK_FALSE &&
			    feature->descriptorBufferCaptureReplay == VK_FALSE &&
			    feature->descriptorBufferImageLayoutIgnored == VK_FALSE &&
			    feature->descriptorBufferPushDescriptors == VK_FALSE)
			{
				remove_extension(active_extensions, out_extension_count, VK_EXT_DESCRIPTOR_BUFFER_EXTENSION_NAME);
				accept = false;
			}
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_OBJECT_FEATURES_EXT:
		{
			auto *feature = reinterpret_cast<VkPhysicalDeviceShaderObjectFeaturesEXT *>(s);
			if (feature->shaderObject == VK_FALSE)
			{
				remove_extension(active_extensions, out_extension_count, VK_EXT_SHADER_OBJECT_EXTENSION_NAME);
				accept = false;
			}
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PRIMITIVES_GENERATED_QUERY_FEATURES_EXT:
		{
			auto *feature = reinterpret_cast<VkPhysicalDevicePrimitivesGeneratedQueryFeaturesEXT *>(s);
			if (feature->primitivesGeneratedQuery == VK_FALSE &&
			    feature->primitivesGeneratedQueryWithNonZeroStreams == VK_FALSE &&
			    feature->primitivesGeneratedQueryWithRasterizerDiscard == VK_FALSE)
			{
				remove_extension(active_extensions, out_extension_count, VK_EXT_PRIMITIVES_GENERATED_QUERY_EXTENSION_NAME);
				accept = false;
			}
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_2D_VIEW_OF_3D_FEATURES_EXT:
		{
			auto *feature = reinterpret_cast<VkPhysicalDeviceImage2DViewOf3DFeaturesEXT *>(s);
			if (feature->image2DViewOf3D == VK_FALSE &&
			    feature->sampler2DViewOf3D == VK_FALSE)
			{
				remove_extension(active_extensions, out_extension_count, VK_EXT_IMAGE_2D_VIEW_OF_3D_EXTENSION_NAME);
				accept = false;
			}
			break;
		}

		default:
			break;
		}

		if (accept)
		{
			*ppNext = s;
			ppNext = reinterpret_cast<void **>(&s->pNext);
			*ppNext = nullptr;
		}
	}
}